

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatdc.c
# Opt level: O0

void ecx_dcsync0(ecx_contextt *context,uint16 slave,boolean act,uint32 CyclTime,uint32 CyclShift)

{
  int iVar1;
  uint local_3c;
  long lStack_38;
  int32 tc;
  int64 t1;
  int64 t;
  undefined2 local_20;
  undefined1 local_1e;
  undefined1 local_1d;
  uint32 uStack_1c;
  uint16 slaveh;
  uint16 wc;
  uint8 RA;
  uint8 h;
  uint32 CyclShift_local;
  uint32 CyclTime_local;
  boolean act_local;
  uint16 slave_local;
  ecx_contextt *context_local;
  
  t._6_2_ = context->slavelist[slave].configadr;
  local_1e = 0;
  uStack_1c = CyclShift;
  _wc = CyclTime;
  CyclShift_local._1_1_ = act;
  CyclShift_local._2_2_ = slave;
  _CyclTime_local = context;
  iVar1 = ecx_FPWR(context->port,t._6_2_,0x981,1,&local_1e,2000);
  local_20 = (undefined2)iVar1;
  if (CyclShift_local._1_1_ != '\0') {
    local_1e = 3;
  }
  local_1d = 0;
  iVar1 = ecx_FPWR(_CyclTime_local->port,t._6_2_,0x980,1,&local_1d,2000);
  local_20 = (undefined2)iVar1;
  iVar1 = ecx_FPRD(_CyclTime_local->port,t._6_2_,0x910,8,&stack0xffffffffffffffc8,2000);
  local_20 = (undefined2)iVar1;
  if (_wc == 0) {
    t1 = lStack_38 + 100000000 + (ulong)uStack_1c;
  }
  else {
    t1 = ((lStack_38 + 100000000) / (long)(ulong)_wc) * (ulong)_wc + (ulong)_wc + (ulong)uStack_1c;
  }
  iVar1 = ecx_FPWR(_CyclTime_local->port,t._6_2_,0x990,8,&t1,2000);
  local_20 = (undefined2)iVar1;
  local_3c = _wc;
  iVar1 = ecx_FPWR(_CyclTime_local->port,t._6_2_,0x9a0,4,&local_3c,2000);
  local_20 = (undefined2)iVar1;
  ecx_FPWR(_CyclTime_local->port,t._6_2_,0x981,1,&local_1e,2000);
  return;
}

Assistant:

void ecx_dcsync0(ecx_contextt *context, uint16 slave, boolean act, uint32 CyclTime, uint32 CyclShift)
{
   uint8 h, RA;
   uint16 wc, slaveh;
   int64 t, t1;
   int32 tc;

   slaveh = context->slavelist[slave].configadr;
   RA = 0;

   /* stop cyclic operation, ready for next trigger */
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYNCACT, sizeof(RA), &RA, EC_TIMEOUTRET); 
   if (act)
   {
       RA = 1 + 2;    /* act cyclic operation and sync0, sync1 deactivated */
   }
   h = 0;
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCCUC, sizeof(h), &h, EC_TIMEOUTRET); /* write access to ethercat */
   wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCSYSTIME, sizeof(t1), &t1, EC_TIMEOUTRET); /* read local time of slave */
   t1 = etohll(t1);

   /* Calculate first trigger time, always a whole multiple of CyclTime rounded up
   plus the shifttime (can be negative)
   This insures best sychronisation between slaves, slaves with the same CyclTime
   will sync at the same moment (you can use CyclShift to shift the sync) */
   if (CyclTime > 0)
   {
       t = ((t1 + SyncDelay) / CyclTime) * CyclTime + CyclTime + CyclShift;
   }
   else
   {
      t = t1 + SyncDelay + CyclShift;
      /* first trigger at T1 + CyclTime + SyncDelay + CyclShift in ns */
   }
   t = htoell(t);
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSTART0, sizeof(t), &t, EC_TIMEOUTRET); /* SYNC0 start time */
   tc = htoel(CyclTime);
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCCYCLE0, sizeof(tc), &tc, EC_TIMEOUTRET); /* SYNC0 cycle time */
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYNCACT, sizeof(RA), &RA, EC_TIMEOUTRET); /* activate cyclic operation */
}